

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O2

int __thiscall
CVmObjVector::gen_index_of
          (CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,int forward,
          int count_only)

{
  vm_val_t *v;
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  vm_obj_id_t vVar4;
  ulong uVar5;
  ulong uVar6;
  vm_obj_id_t vVar7;
  bool bVar8;
  vm_val_t ele;
  
  if ((gen_index_of(unsigned_int,vm_val_t*,unsigned_int*,int,int)::desc == '\0') &&
     (iVar3 = __cxa_guard_acquire(&gen_index_of(unsigned_int,vm_val_t*,unsigned_int*,int,int)::desc)
     , iVar3 != 0)) {
    gen_index_of::desc.min_argc_ = 1;
    gen_index_of::desc.opt_argc_ = 0;
    gen_index_of::desc.varargs_ = 0;
    __cxa_guard_release(&gen_index_of(unsigned_int,vm_val_t*,unsigned_int*,int,int)::desc);
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&gen_index_of::desc);
  pvVar2 = sp_;
  if (iVar3 != 0) {
    return 1;
  }
  v = sp_ + -1;
  pvVar1 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar1 = VM_OBJ;
  (pvVar2->val).obj = self;
  retval->typ = VM_NIL;
  uVar5 = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
  vVar4 = 0;
  bVar8 = forward == 0;
  uVar6 = 0;
  if (bVar8) {
    uVar6 = uVar5;
  }
  vVar7 = ((int)uVar6 - (uint)bVar8) + 1;
  do {
    if (forward == 0) {
      if (uVar6 == 0) {
LAB_0027f388:
        sp_ = sp_ + -2;
        if (count_only == 0) {
          return 1;
        }
        retval->typ = VM_INT;
        (retval->val).obj = vVar4;
        return 1;
      }
    }
    else if (uVar5 <= uVar6) goto LAB_0027f388;
    get_element(this,uVar6 - bVar8,&ele);
    iVar3 = vm_val_t::equals(&ele,v,0);
    if (iVar3 != 0) {
      if (count_only == 0) {
        retval->typ = VM_INT;
        (retval->val).obj = vVar7;
        sp_ = sp_ + -2;
        return 1;
      }
      vVar4 = vVar4 + 1;
    }
    uVar6 = (uVar6 - bVar8) + (ulong)!bVar8;
    vVar7 = vVar7 + ((uint)!bVar8 - (uint)bVar8);
  } while( true );
}

Assistant:

int CVmObjVector::gen_index_of(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc, int forward, int count_only)
{
    const vm_val_t *val;
    size_t cnt;
    size_t idx;
    int val_cnt;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value, but leave it on the stack */
    val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* presume we won't find a matching element */
    retval->set_nil();
    val_cnt = 0;

    /* get the number of elements to visit */
    cnt = get_element_count();

    /* start at the first or last element, depending on the direction */
    idx = (forward ? 0 : cnt);

    /* scan the list, looking for the element */
    for (;;)
    {
        vm_val_t ele;

        /* if we've reached the last element, stop looking */
        if (forward ? idx >= cnt : idx == 0)
            break;

        /* if we're going backwards, move to the next element position */
        if (!forward)
            --idx;

        /* get this element */
        get_element(idx, &ele);

        /* if the element matches the search value, return its index */
        if (ele.equals(vmg_ val))
        {
            /* it matches - see what we're doing */
            if (count_only)
            {
                /* they only want the count */
                ++val_cnt;
            }
            else
            {
                /* this is the one - return its 1-based index */
                retval->set_int(idx + 1);
                
                /* foind it - no need to keep searching */
                break;
            }
        }

        /* if we're going forwards, move to the next element */
        if (forward)
            ++idx;
    }

    /* discard our gc protection (self) and our arguments */
    G_stk->discard(2);

    /* return the count if desired */
    if (count_only)
        retval->set_int(val_cnt);
    
    /* handled */
    return TRUE;
}